

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

bool GenerateAuthCookie(string *cookie_out,optional<std::filesystem::perms> cookie_perms)

{
  Span<unsigned_char> bytes;
  byte bVar1;
  bool bVar2;
  perms *ppVar3;
  ConstevalFormatString<1U> fmt;
  long in_RDI;
  long in_FS_OFFSET;
  size_t COOKIE_SIZE;
  error_code code;
  path filepath;
  path filepath_tmp;
  ofstream file;
  string cookie;
  uchar rand_pwd [32];
  undefined4 in_stack_fffffffffffffa88;
  undefined4 uVar4;
  openmode in_stack_fffffffffffffa8c;
  path *in_stack_fffffffffffffa90;
  char *pcVar5;
  basic_ofstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  path *in_stack_fffffffffffffaa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffaa8;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  perms p;
  LogFlags in_stack_fffffffffffffaf0;
  undefined8 in_stack_fffffffffffffaf8;
  int iVar6;
  Span<const_unsigned_char> in_stack_fffffffffffffb10;
  bool local_4c9;
  ConstevalFormatString<1U> in_stack_fffffffffffffb38;
  string_view in_stack_fffffffffffffb40;
  string_view in_stack_fffffffffffffb50;
  error_code local_460 [7];
  error_category *local_3e8 [3];
  Level in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  path local_2f8 [2];
  ostream local_288 [576];
  string local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p = (perms)((ulong)local_28 >> 0x20);
  Span<unsigned_char>::Span<32>
            ((Span<unsigned_char> *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
             (uchar (*) [32])0xe44922);
  bytes.m_size = (size_t)in_stack_fffffffffffffa98;
  bytes.m_data = (uchar *)in_stack_fffffffffffffa90;
  GetRandBytes(bytes);
  std::operator+(in_stack_fffffffffffffac0,
                 (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
  Span<const_unsigned_char>::Span<32>
            ((Span<const_unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),(uchar (*) [32])0xe44964)
  ;
  HexStr_abi_cxx11_(in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffac0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  std::ofstream::ofstream(local_288);
  GetAuthCookieFile((bool)in_stack_fffffffffffffabf);
  std::basic_ofstream<char,_std::char_traits<char>_>::open<fs::path>
            (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffa90);
    uVar4 = 2;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb40,iVar6,in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,in_stack_fffffffffffffc40);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,uVar4));
    local_4c9 = false;
    goto LAB_00e4518e;
  }
  std::operator<<(local_288,local_48);
  std::ofstream::close();
  GetAuthCookieFile((bool)in_stack_fffffffffffffabf);
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                 (path *)0xe44bff);
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                 (path *)0xe44c16);
  bVar2 = RenameOver((path *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::filesystem::perms> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (bVar2) {
      std::error_code::error_code
                ((error_code *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      ppVar3 = std::optional<std::filesystem::perms>::value
                         ((optional<std::filesystem::perms> *)in_stack_fffffffffffffa98);
      std::filesystem::permissions(local_2f8,*ppVar3,replace,local_460);
      bVar2 = std::error_code::operator_cast_to_bool
                        ((error_code *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                        );
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
        pcVar5 = "Unable to set permissions on cookie authentication file %s\n";
        fs::PathToString_abi_cxx11_(in_stack_fffffffffffffa90);
        uVar4 = 2;
        LogPrintFormatInternal<std::__cxx11::string>
                  (in_stack_fffffffffffffb50,in_stack_fffffffffffffb40,iVar6,(LogFlags)pcVar5,
                   in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,in_stack_fffffffffffffc40);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa8c,uVar4));
        local_4c9 = false;
        goto LAB_00e45170;
      }
    }
    g_generated_cookie = true;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffa90);
    uVar4 = 2;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb40,iVar6,in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,in_stack_fffffffffffffc40);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,uVar4));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    fmt.fmt = (char *)std::filesystem::status(local_2f8);
    std::filesystem::file_status::permissions
              ((file_status *)CONCAT44(in_stack_fffffffffffffa8c,uVar4));
    PermsToSymbolicString_abi_cxx11_(p);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_460[7]._M_cat
    ;
    pcVar5 = "Permissions used for cookie: %s\n";
    uVar4 = 2;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb40,iVar6,in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffc30,fmt,in_stack_fffffffffffffc40);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,uVar4));
    if (in_RDI != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar5);
    }
    local_4c9 = true;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    iVar6 = 0;
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffa90);
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffa90);
    uVar4 = 2;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb40,iVar6,in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffc30,(ConstevalFormatString<2U>)in_stack_fffffffffffffb38.fmt,
               in_stack_fffffffffffffc40,in_stack_fffffffffffffc48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,uVar4));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,uVar4));
    local_4c9 = false;
  }
LAB_00e45170:
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa8c,uVar4));
LAB_00e4518e:
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa8c,uVar4));
  std::ofstream::~ofstream(local_288);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,uVar4));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c9;
}

Assistant:

bool GenerateAuthCookie(std::string* cookie_out, std::optional<fs::perms> cookie_perms)
{
    const size_t COOKIE_SIZE = 32;
    unsigned char rand_pwd[COOKIE_SIZE];
    GetRandBytes(rand_pwd);
    std::string cookie = COOKIEAUTH_USER + ":" + HexStr(rand_pwd);

    /** the umask determines what permissions are used to create this file -
     * these are set to 0077 in common/system.cpp.
     */
    std::ofstream file;
    fs::path filepath_tmp = GetAuthCookieFile(true);
    file.open(filepath_tmp);
    if (!file.is_open()) {
        LogInfo("Unable to open cookie authentication file %s for writing\n", fs::PathToString(filepath_tmp));
        return false;
    }
    file << cookie;
    file.close();

    fs::path filepath = GetAuthCookieFile(false);
    if (!RenameOver(filepath_tmp, filepath)) {
        LogInfo("Unable to rename cookie authentication file %s to %s\n", fs::PathToString(filepath_tmp), fs::PathToString(filepath));
        return false;
    }
    if (cookie_perms) {
        std::error_code code;
        fs::permissions(filepath, cookie_perms.value(), fs::perm_options::replace, code);
        if (code) {
            LogInfo("Unable to set permissions on cookie authentication file %s\n", fs::PathToString(filepath_tmp));
            return false;
        }
    }

    g_generated_cookie = true;
    LogInfo("Generated RPC authentication cookie %s\n", fs::PathToString(filepath));
    LogInfo("Permissions used for cookie: %s\n", PermsToSymbolicString(fs::status(filepath).permissions()));

    if (cookie_out)
        *cookie_out = cookie;
    return true;
}